

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcher.cpp
# Opt level: O2

void FileWatcherDestroy(HFileWatcher handle)

{
  LOCK();
  *(undefined1 *)((long)handle + 0x28) = 1;
  UNLOCK();
  std::thread::join();
  FileWatcher::~FileWatcher((FileWatcher *)handle);
  operator_delete(handle,0x68);
  return;
}

Assistant:

void FileWatcherDestroy(HFileWatcher handle) {
    FileWatcher* watcher = (FileWatcher*)handle;
    watcher->ShouldQuit.store(true);
    watcher->WatcherThread.join();
    delete watcher;
}